

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

String * __thiscall
kj::encodeUriPath(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> bytes)

{
  kj kVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  uint uVar5;
  kj *pkVar6;
  uchar *puVar7;
  size_t sVar8;
  uchar *puVar9;
  byte bVar10;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  undefined1 auVar11 [16];
  char cVar15;
  char cVar30;
  char cVar31;
  char cVar32;
  undefined1 auVar19 [16];
  undefined1 auVar26 [16];
  Vector<char> local_58;
  String *local_38;
  undefined1 auVar27 [16];
  undefined1 auVar20 [16];
  undefined1 auVar16 [11];
  undefined1 auVar21 [16];
  undefined1 auVar28 [16];
  undefined1 auVar17 [12];
  undefined1 auVar22 [16];
  undefined1 auVar18 [13];
  undefined1 auVar23 [16];
  undefined1 auVar29 [16];
  undefined1 auVar25 [16];
  undefined1 auVar24 [16];
  undefined2 uVar33;
  
  puVar7 = bytes.ptr;
  local_38 = __return_storage_ptr__;
  local_58.builder.pos =
       (RemoveConst<char> *)
       _::HeapArrayDisposer::allocateImpl
                 (1,0,(size_t)(puVar7 + 1),(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  pkVar6 = (kj *)local_58.builder.pos + (long)puVar7 + 1;
  local_58.builder.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_58.builder.ptr = local_58.builder.pos;
  local_58.builder.endPtr = (char *)pkVar6;
  if (puVar7 != (uchar *)0x0) {
    puVar9 = (uchar *)0x0;
    do {
      kVar1 = this[(long)puVar9];
      auVar11 = pshuflw(ZEXT216(CONCAT11(kVar1,kVar1)),ZEXT216(CONCAT11(kVar1,kVar1)),0);
      bVar10 = auVar11[0] - 0x40;
      bVar12 = auVar11[1] + 0x9f;
      bVar13 = auVar11[2] - 0x30;
      bVar14 = auVar11[3] - 0x26;
      cVar15 = -((byte)((bVar10 < 0x1c) * '\x1c' | (bVar10 >= 0x1c) * bVar10) == bVar10);
      cVar30 = -((byte)((bVar12 < 0x1a) * '\x1a' | (bVar12 >= 0x1a) * bVar12) == bVar12);
      cVar31 = -((byte)((bVar13 < 0xc) * '\f' | (bVar13 >= 0xc) * bVar13) == bVar13);
      cVar32 = -((byte)((bVar14 < 9) * '\t' | (bVar14 >= 9) * bVar14) == bVar14);
      auVar20._0_9_ = CONCAT18(0xff,0xff00000000000000);
      auVar16._0_10_ = CONCAT19(0xff,auVar20._0_9_);
      auVar16[10] = 0xff;
      auVar17[0xb] = 0xff;
      auVar17._0_11_ = auVar16;
      auVar18[0xc] = 0xff;
      auVar18._0_12_ = auVar17;
      auVar25[0xd] = 0xff;
      auVar25._0_13_ = auVar18;
      auVar25[0xe] = 0xff;
      auVar25[0xf] = 0xff;
      auVar24._14_2_ = auVar25._14_2_;
      auVar24[0xd] = 0xff;
      auVar24._0_13_ = auVar18;
      auVar23._13_3_ = auVar24._13_3_;
      auVar23[0xc] = 0xff;
      auVar23._0_12_ = auVar17;
      auVar22._12_4_ = auVar23._12_4_;
      auVar22[0xb] = 0xff;
      auVar22._0_11_ = auVar16;
      auVar21._11_5_ = auVar22._11_5_;
      auVar21[10] = 0xff;
      auVar21._0_10_ = auVar16._0_10_;
      auVar20._10_6_ = auVar21._10_6_;
      auVar20[9] = 0xff;
      auVar19._9_7_ = auVar20._9_7_;
      auVar19[8] = 0xff;
      auVar19._0_8_ = 0xff00000000000000;
      Var4 = CONCAT91(CONCAT81(auVar19._8_8_,cVar32),cVar32);
      auVar3._2_10_ = Var4;
      auVar3[1] = cVar31;
      auVar3[0] = cVar31;
      auVar2._2_12_ = auVar3;
      auVar2[1] = cVar30;
      auVar2[0] = cVar30;
      auVar11._0_2_ = CONCAT11(cVar15,cVar15);
      auVar11._2_14_ = auVar2;
      uVar33 = (undefined2)Var4;
      auVar29._0_12_ = auVar11._0_12_;
      auVar29._12_2_ = uVar33;
      auVar29._14_2_ = uVar33;
      auVar28._12_4_ = auVar29._12_4_;
      auVar28._0_10_ = auVar11._0_10_;
      auVar28._10_2_ = auVar3._0_2_;
      auVar27._10_6_ = auVar28._10_6_;
      auVar27._0_8_ = auVar11._0_8_;
      auVar27._8_2_ = auVar3._0_2_;
      auVar26._8_8_ = auVar27._8_8_;
      auVar26._6_2_ = auVar2._0_2_;
      auVar26._4_2_ = auVar2._0_2_;
      auVar26._2_2_ = auVar11._0_2_;
      auVar26._0_2_ = auVar11._0_2_;
      uVar5 = movmskps((int)pkVar6,auVar26);
      pkVar6 = (kj *)(ulong)(uVar5 ^ 0xf);
      if ((((uVar5 ^ 0xf) == 0) &&
          (((pkVar6 = (kj *)(ulong)((byte)kVar1 - 0x21), 0x3e < (byte)kVar1 - 0x21 ||
            ((0x7000000010000009U >> ((ulong)pkVar6 & 0x3f) & 1) == 0)) && (kVar1 != (kj)0x7e)))) &&
         ((byte)kVar1 != 0x7c)) {
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar8 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.pos == local_58.builder.ptr) {
            sVar8 = 4;
          }
          Vector<char>::setCapacity(&local_58,sVar8);
        }
        *local_58.builder.pos = '%';
        local_58.builder.pos = local_58.builder.pos + 1;
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar8 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.pos == local_58.builder.ptr) {
            sVar8 = 4;
          }
          Vector<char>::setCapacity(&local_58,sVar8);
        }
        *local_58.builder.pos = (RemoveConst<char>)*(kj *)("0123456789ABCDEF" + ((byte)kVar1 >> 4));
        local_58.builder.pos = local_58.builder.pos + 1;
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar8 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.pos == local_58.builder.ptr) {
            sVar8 = 4;
          }
          Vector<char>::setCapacity(&local_58,sVar8);
        }
        pkVar6 = (kj *)CONCAT71(0x193e,*(kj *)("0123456789ABCDEF" + ((byte)kVar1 & 0xf)));
        *local_58.builder.pos = (RemoveConst<char>)*(kj *)("0123456789ABCDEF" + ((byte)kVar1 & 0xf))
        ;
      }
      else {
        if (local_58.builder.pos == local_58.builder.endPtr) {
          sVar8 = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
          if (local_58.builder.pos == local_58.builder.ptr) {
            sVar8 = 4;
          }
          pkVar6 = (kj *)local_58.builder.ptr;
          Vector<char>::setCapacity(&local_58,sVar8);
        }
        *local_58.builder.pos = (RemoveConst<char>)kVar1;
      }
      local_58.builder.pos = local_58.builder.pos + 1;
      puVar9 = puVar9 + 1;
    } while (puVar7 != puVar9);
  }
  if (local_58.builder.pos == local_58.builder.endPtr) {
    sVar8 = 4;
    if (local_58.builder.endPtr != local_58.builder.ptr) {
      sVar8 = ((long)local_58.builder.endPtr - (long)local_58.builder.ptr) * 2;
    }
    Vector<char>::setCapacity(&local_58,sVar8);
  }
  *local_58.builder.pos = '\0';
  local_58.builder.pos = local_58.builder.pos + 1;
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (local_38->content).ptr = local_58.builder.ptr;
  (local_38->content).size_ = (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (local_38->content).disposer = local_58.builder.disposer;
  return local_38;
}

Assistant:

String encodeUriPath(ArrayPtr<const byte> bytes) {
  Vector<char> result(bytes.size() + 1);
  for (byte b: bytes) {
    if (('@' <= b && b <= '[') || // covers A-Z
        ('a' <= b && b <= 'z') ||
        ('0' <= b && b <= ';') || // covers 0-9
        ('&' <= b && b <= '.') ||
        b == '_' || b == '!' || b == '=' || b == ']' ||
        b == '^' || b == '|' || b == '~' || b == '$') {
      result.add(b);
    } else {
      result.add('%');
      result.add(HEX_DIGITS_URI[b/16]);
      result.add(HEX_DIGITS_URI[b%16]);
    }
  }
  result.add('\0');
  return String(result.releaseAsArray());
}